

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_draw.cxx
# Opt level: O0

void gl_font(int fontid,int size)

{
  uint uVar1;
  Fl_Font_Descriptor *pFVar2;
  Fl_Font_Descriptor *fl_fontsize;
  int size_local;
  int fontid_local;
  
  fl_font(fontid,size);
  pFVar2 = Fl_Graphics_Driver::font_descriptor(fl_graphics_driver);
  if (pFVar2->listbase == 0) {
    uVar1 = glGenLists(0x10000);
    pFVar2->listbase = uVar1;
  }
  glListBase(pFVar2->listbase);
  gl_fontsize = pFVar2;
  return;
}

Assistant:

void  gl_font(int fontid, int size) {
  fl_font(fontid, size);
  Fl_Font_Descriptor *fl_fontsize = fl_graphics_driver->font_descriptor();
#ifndef __APPLE__
  if (!fl_fontsize->listbase) {

#ifdef  USE_OksiD_style_GL_font_selection
#undef GENLISTSIZE
#define GENLISTSIZE 0x10000
    fl_fontsize->listbase = glGenLists(GENLISTSIZE);
#else // Fltk-1.1.8 style GL font selection

#if defined (USE_X11) // X-windows options follow, either XFT or "plain" X
// FIXME:  warning Ideally, for XFT, we really need a glXUseXftFont implementation here...
// FIXME:  warning GL font selection is basically wrong here
/* OksiD had a fairly sophisticated scheme for storing multiple X fonts in a XUtf8FontStruct,
 * then sorting through them at draw time (for normal X rendering) to find which one can
 * render the current glyph... But for now, just use the first font in the list for GL...
 */
    XFontStruct *font = fl_X_core_font();
    int base = font->min_char_or_byte2;
    int count = font->max_char_or_byte2-base+1;
    fl_fontsize->listbase = glGenLists(GENLISTSIZE);
    glXUseXFont(font->fid, base, count, fl_fontsize->listbase+base);
# elif defined(WIN32)
    // this is unused because USE_OksiD_style_GL_font_selection == 1
    int base = fl_fontsize->metr.tmFirstChar;
    int count = fl_fontsize->metr.tmLastChar-base+1;
    HFONT oldFid = (HFONT)SelectObject(fl_gc, fl_fontsize->fid);
    fl_fontsize->listbase = glGenLists(GENLISTSIZE);
    wglUseFontBitmaps(fl_gc, base, count, fl_fontsize->listbase+base);
    SelectObject(fl_gc, oldFid);
# endif

#endif // USE_OksiD_style_GL_font_selection
  }
  glListBase(fl_fontsize->listbase);
#endif // !__APPLE__
  gl_fontsize = fl_fontsize;
}